

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::OutputHelper<google::protobuf::internal::ArrayOutput,_5>::Serialize
               (void *ptr,ArrayOutput *output)

{
  uint uVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  pbVar3 = output->ptr;
  uVar1 = *ptr;
  if ((ulong)(long)(int)uVar1 < 0x80) {
    *pbVar3 = (byte)uVar1;
    pbVar3 = pbVar3 + 1;
  }
  else {
    *pbVar3 = (byte)uVar1 | 0x80;
    uVar5 = (ulong)(long)(int)uVar1 >> 7;
    if (uVar1 < 0x4000) {
      pbVar3[1] = (byte)uVar5;
      pbVar3 = pbVar3 + 2;
    }
    else {
      pbVar3 = pbVar3 + 2;
      do {
        pbVar4 = pbVar3;
        pbVar4[-1] = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar3 = pbVar4 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar2);
      *pbVar4 = (byte)uVar6;
    }
  }
  output->ptr = pbVar3;
  return;
}

Assistant:

static void Serialize(const void* ptr, ArrayOutput* output) {
    output->ptr = PrimitiveTypeHelper<type>::SerializeToArray(ptr, output->ptr);
  }